

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

target_ulong do_sdiv(CPUSPARCState_conflict1 *env,target_ulong a,target_ulong b,int cc,uintptr_t ra)

{
  target_ulong tVar1;
  int32_t x1;
  bool bVar2;
  
  if ((int)b != 0) {
    tVar1 = (long)(env->y << 0x20 | a & 0xffffffff) / (long)(int)b;
    bVar2 = (long)(int)tVar1 != tVar1;
    if (bVar2) {
      tVar1 = (long)tVar1 >> 0x3f ^ 0x7fffffff;
    }
    if (cc != 0) {
      env->cc_dst = tVar1;
      env->cc_src2 = (ulong)bVar2;
      env->cc_op = 2;
    }
    return tVar1;
  }
  cpu_raise_exception_ra_sparc64(env,0x28,ra);
}

Assistant:

static target_ulong do_sdiv(CPUSPARCState *env, target_ulong a,
                            target_ulong b, int cc, uintptr_t ra)
{
    int overflow = 0;
    int64_t x0;
    int32_t x1;

    x0 = (a & 0xffffffff) | ((int64_t) (env->y) << 32);
    x1 = (b & 0xffffffff);

    if (x1 == 0) {
        cpu_raise_exception_ra(env, TT_DIV_ZERO, ra);
    } else if (x1 == -1 && x0 == INT64_MIN) {
        x0 = INT32_MAX;
        overflow = 1;
    } else {
        x0 = x0 / x1;
        if ((int32_t) x0 != x0) {
            x0 = x0 < 0 ? INT32_MIN : INT32_MAX;
            overflow = 1;
        }
    }

    if (cc) {
        env->cc_dst = x0;
        env->cc_src2 = overflow;
        env->cc_op = CC_OP_DIV;
    }
    return x0;
}